

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void starvation_loop(size_t W)

{
  Node *pNVar1;
  Node *pNVar2;
  code *pcVar3;
  double dVar4;
  FlowBuilder FVar5;
  FlowBuilder this;
  char extraout_AL;
  element_type *peVar6;
  _Head_base<0UL,_std::__future_base::_Result_base_*,_false> _Var7;
  _Result_base *p_Var8;
  size_t l;
  Executor *this_00;
  Node *this_01;
  ulong uVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  atomic<unsigned_long> counter;
  Future<void> local_310;
  atomic<unsigned_long> barrier;
  size_t W_local;
  Task second;
  size_t L;
  _Ptr_type *local_2d0;
  _Head_base<0UL,_tf::Node_*,_false> local_2c8;
  _Head_base<0UL,_tf::Node_*,_false> local_2c0;
  Node *local_2b8;
  size_t B;
  shared_ptr<tf::WorkerInterface> local_2a8;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  Executor executor;
  Taskflow taskflow;
  
  L = 100;
  B = 0x400;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  executor._notifier._7_2_ = 0x17;
  executor._notifier._waiters.
  super__Vector_base<tf::NonblockingNotifierV2::Waiter,_std::allocator<tf::NonblockingNotifierV2::Waiter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0x17;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__align =
       *(long *)(doctest::detail::g_cs + 0x20);
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__owner = 0xc;
  executor._taskflows_mutex.super___mutex_base._M_mutex._16_8_ = anon_var_dwarf_4f812;
  executor._taskflows_mutex.super___mutex_base._M_mutex._24_4_ = 0xb4;
  executor._taskflows_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)anon_var_dwarf_4fa3e;
  executor._workers.super__Vector_base<tf::Worker,_std::allocator<tf::Worker>_>._M_impl.
  super__Vector_impl_data._M_start._0_2_ = 1;
  executor._topology_cv = (condition_variable)0x0;
  executor._104_8_ = (long)"TracerPid:\t" + 0xb;
  executor._112_8_ = (long)"TracerPid:\t" + 0xb;
  set._M_h._M_bucket_count = CONCAT44(set._M_h._M_bucket_count._4_4_,0xc);
  W_local = W;
  set._M_h._M_buckets = (__buckets_ptr)&B;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            ((Result *)&taskflow,(Expression_lhs<const_unsigned_long_&> *)&set,&W_local);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)&executor,(Result *)&taskflow);
  doctest::String::~String((String *)&taskflow._mutex);
  dVar4 = doctest::detail::ResultBuilder::log
                    ((ResultBuilder *)&executor,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da))
  ;
  if (extraout_AL != '\0') {
    pcVar3 = (code *)swi(3);
    (*pcVar3)(SUB84(dVar4,0));
    return;
  }
  doctest::detail::ResultBuilder::react((ResultBuilder *)&executor);
  doctest::AssertData::~AssertData((AssertData *)&executor);
  tf::Taskflow::Taskflow(&taskflow);
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W_local,&local_2a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2a8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar5 = taskflow.super_FlowBuilder;
  counter.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  barrier.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  peVar6 = (element_type *)operator_new(0xd8);
  peVar6->_vptr__State_baseV2 = (_func_int **)0x0;
  (peVar6->_M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)&peVar6->_M_once;
  peVar6->_M_status = (atomic<unsigned_int>)0x0;
  peVar6->_M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6->field_0x15 = 0;
  *(undefined1 *)&(peVar6->_M_once)._M_once = 0;
  peVar6[1]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[1]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[1]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[1].field_0x15 = 0;
  *(undefined8 *)&peVar6[1]._M_once = 0;
  peVar6[2]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar6[2]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)(peVar6 + 3);
  *(_Result_base **)&peVar6[2]._M_status = (_Result_base *)(peVar6 + 3);
  *(element_type **)&peVar6[2]._M_once = peVar6 + 4;
  peVar6[4]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar6[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[4]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[4]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[4].field_0x15 = 0;
  *(undefined8 *)&peVar6[4]._M_once = 0;
  peVar6[5]._vptr__State_baseV2 = (_func_int **)0x0;
  _Var7._M_head_impl = (_Result_base *)operator_new(0x30);
  *(atomic<unsigned_long> **)_Var7._M_head_impl = &barrier;
  *(size_t **)(_Var7._M_head_impl + 8) = &B;
  *(atomic<unsigned_long> **)(_Var7._M_head_impl + 0x10) = &counter;
  *(size_t **)(_Var7._M_head_impl + 0x18) = &L;
  *(unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> **)
   (_Var7._M_head_impl + 0x20) = &set;
  *(size_t **)(_Var7._M_head_impl + 0x28) = &W_local;
  peVar6[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       _Var7._M_head_impl;
  peVar6[5]._vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:193:5)>
       ::_M_invoke;
  *(code **)&peVar6[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:193:5)>
       ::_M_manager;
  *(undefined1 *)&peVar6[6]._vptr__State_baseV2 = 1;
  peVar6[6]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[6]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[6]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[6].field_0x15 = 0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  this = taskflow.super_FlowBuilder;
  pNVar1 = ((FVar5._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)operator_new(0xd8);
  (local_310.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _vptr__State_baseV2 = (_func_int **)0x0;
  ((local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       &(local_310.super_future<void>.super___basic_future<void>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _M_once;
  (local_310.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_status = (atomic<unsigned_int>)0x0;
  (local_310.super_future<void>.super___basic_future<void>._M_state.
   super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &(local_310.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    field_0x15 = 0;
  *(undefined1 *)
   &((local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_once)._M_once = 0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_status = (atomic<unsigned_int>)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    field_0x15 = 0;
  *(undefined8 *)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_once = 0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)
       (local_310.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 3
       );
  *(_Result_base **)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_status = (_Result_base *)
                (local_310.super_future<void>.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr + 3);
  *(element_type **)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_once = local_310.super_future<void>.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr + 4;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _vptr__State_baseV2 = (_func_int **)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_status = (atomic<unsigned_int>)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    field_0x15 = 0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
  _vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:201:5)>
       ::_M_invoke;
  *(code **)&local_310.super_future<void>.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr[4]._M_once =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:201:5)>
       ::_M_manager;
  *(undefined1 *)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _vptr__State_baseV2 = 4;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_status = (atomic<unsigned_int>)0x0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
  _M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)
   &local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    field_0x15 = 0;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)this._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  FVar5 = taskflow.super_FlowBuilder;
  pNVar2 = ((this._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  peVar6 = (element_type *)operator_new(0xd8);
  peVar6->_vptr__State_baseV2 = (_func_int **)0x0;
  local_2d0 = &peVar6->_M_result;
  (peVar6->_M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)&peVar6->_M_once;
  peVar6->_M_status = (atomic<unsigned_int>)0x0;
  peVar6->_M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6->field_0x15 = 0;
  *(undefined1 *)&(peVar6->_M_once)._M_once = 0;
  peVar6[1]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[1]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[1]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[1].field_0x15 = 0;
  *(undefined8 *)&peVar6[1]._M_once = 0;
  peVar6[2]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar6[2]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)(peVar6 + 3);
  *(_Result_base **)&peVar6[2]._M_status = (_Result_base *)(peVar6 + 3);
  *(element_type **)&peVar6[2]._M_once = peVar6 + 4;
  peVar6[4]._vptr__State_baseV2 = (_func_int **)0x0;
  peVar6[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[4]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[4]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[4].field_0x15 = 0;
  *(undefined8 *)&peVar6[4]._M_once = 0;
  peVar6[5]._vptr__State_baseV2 = (_func_int **)0x0;
  _Var7._M_head_impl = (_Result_base *)operator_new(0x18);
  *(atomic<unsigned_long> **)_Var7._M_head_impl = &barrier;
  *(atomic<unsigned_long> **)(_Var7._M_head_impl + 8) = &counter;
  *(unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> **)
   (_Var7._M_head_impl + 0x10) = &set;
  peVar6[4]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       _Var7._M_head_impl;
  peVar6[5]._vptr__State_baseV2 =
       (_func_int **)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:204:5)>
       ::_M_invoke;
  *(code **)&peVar6[4]._M_once =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:204:5)>
       ::_M_manager;
  *(undefined1 *)&peVar6[6]._vptr__State_baseV2 = 1;
  peVar6[6]._M_result._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)0x0;
  peVar6[6]._M_status = (atomic<unsigned_int>)0x0;
  peVar6[6]._M_retrieved = (__atomic_flag_base)0x0;
  *(undefined3 *)&peVar6[6].field_0x15 = 0;
  local_310.super_future<void>.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
  local_2c8._M_head_impl =
       ((FVar5._graph)->
       super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ).
       super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
       super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
       super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
       super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  second._node = (Node *)0x0;
  this_01 = (Node *)0x0;
  local_2c0._M_head_impl = pNVar2;
  local_2b8 = pNVar1;
  for (_Var7._M_head_impl = (_Result_base *)0x0; FVar5._graph = taskflow.super_FlowBuilder._graph,
      _Var7._M_head_impl < L; _Var7._M_head_impl = _Var7._M_head_impl + 1) {
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)operator_new(0xd8);
    (local_310.super_future<void>.super___basic_future<void>._M_state.
     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr__State_baseV2 = (_func_int **)0x0;
    ((local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)
         &(local_310.super_future<void>.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_M_once;
    *(undefined8 *)
     &((local_310.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_status)._M_data = 0;
    *(undefined1 *)
     &((local_310.super_future<void>.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _M_once)._M_once = 0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_status = (atomic<unsigned_int>)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      field_0x15 = 0;
    *(undefined8 *)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
      _M_once = 0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _vptr__State_baseV2 = (_func_int **)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)
         (local_310.super_future<void>.super___basic_future<void>._M_state.
          super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
         3);
    *(element_type **)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
      _M_status = local_310.super_future<void>.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 3;
    *(element_type **)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[2].
      _M_once = local_310.super_future<void>.super___basic_future<void>._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr + 4;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _vptr__State_baseV2 = (_func_int **)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)_Var7._M_head_impl;
    *(atomic<unsigned_long> **)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[4].
      _M_status = &counter;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[5].
    _vptr__State_baseV2 =
         (_func_int **)
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:216:29)>
         ::_M_invoke;
    *(code **)&local_310.super_future<void>.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr[4]._M_once =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:216:29)>
         ::_M_manager;
    *(undefined1 *)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
      _vptr__State_baseV2 = 1;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false> =
         (_Head_base<0UL,_std::__future_base::_Result_base_*,_false>)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _M_status = (atomic<unsigned_int>)0x0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
    _M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)
     &local_310.super_future<void>.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr[6].
      field_0x15 = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
    pNVar1 = ((FVar5._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    if (_Var7._M_head_impl != (_Result_base *)0x0) {
      tf::Node::_precede(this_01,pNVar1);
      if (_Var7._M_head_impl == (_Result_base *)0x1) {
        second._node = pNVar1;
      }
    }
    this_01 = pNVar1;
  }
  tf::Task::precede<tf::Task&,tf::Task&>((Task *)&local_2c0,&second,(Task *)&local_2c8);
  for (uVar9 = 0; FVar5._graph = taskflow.super_FlowBuilder._graph, uVar9 < B; uVar9 = uVar9 + 1) {
    peVar6 = (element_type *)operator_new(0xd8);
    peVar6->_vptr__State_baseV2 = (_func_int **)0x0;
    (peVar6->_M_result)._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)&peVar6->_M_once;
    peVar6->_M_status = (atomic<unsigned_int>)0x0;
    peVar6->_M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)&peVar6->field_0x15 = 0;
    *(undefined1 *)&(peVar6->_M_once)._M_once = 0;
    peVar6[1]._M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    peVar6[1]._M_status = (atomic<unsigned_int>)0x0;
    peVar6[1]._M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)&peVar6[1].field_0x15 = 0;
    *(undefined8 *)&peVar6[1]._M_once = 0;
    peVar6[2]._vptr__State_baseV2 = (_func_int **)0x0;
    peVar6[2]._M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)(peVar6 + 3);
    *(element_type **)&peVar6[2]._M_status = peVar6 + 3;
    *(element_type **)&peVar6[2]._M_once = peVar6 + 4;
    peVar6[4]._vptr__State_baseV2 = (_func_int **)0x0;
    peVar6[4]._M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    peVar6[4]._M_status = (atomic<unsigned_int>)0x0;
    peVar6[4]._M_retrieved = (__atomic_flag_base)0x0;
    *(undefined3 *)&peVar6[4].field_0x15 = 0;
    *(undefined8 *)&peVar6[4]._M_once = 0;
    peVar6[5]._vptr__State_baseV2 = (_func_int **)0x0;
    p_Var8 = (_Result_base *)operator_new(0x30);
    *(mutex **)p_Var8 = &mutex;
    *(unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> **)(p_Var8 + 8) =
         &set;
    *(Executor **)(p_Var8 + 0x10) = &executor;
    *(atomic<unsigned_long> **)(p_Var8 + 0x18) = &barrier;
    *(size_t **)(p_Var8 + 0x20) = &W_local;
    *(atomic<unsigned_long> **)(p_Var8 + 0x28) = &counter;
    peVar6[4]._M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl = p_Var8;
    peVar6[5]._vptr__State_baseV2 =
         (_func_int **)
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:238:38)>
         ::_M_invoke;
    *(code **)&peVar6[4]._M_once =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:238:38)>
         ::_M_manager;
    *(undefined1 *)&peVar6[6]._vptr__State_baseV2 = 1;
    peVar6[6]._M_result._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
         (_Result_base *)0x0;
    *(undefined8 *)&peVar6[6]._M_status._M_data = 0;
    local_310.super_future<void>.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar6;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_310);
    pNVar1 = ((FVar5._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    tf::Node::_precede(this_01,pNVar1);
    tf::Node::_precede(pNVar1,local_2b8);
  }
  tf::Node::_precede(local_2b8,local_2c0._M_head_impl);
  this_00 = &executor;
  tf::Executor::run(&local_310,this_00,&taskflow);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_310,this_00);
  tf::Future<void>::~Future(&local_310);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void starvation_loop(size_t W) {

  size_t L=100, B = 1024;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  auto [merge, cond, stop] = taskflow.emplace(
    [&](){  
      REQUIRE(barrier.load(std::memory_order_relaxed) == B);
      REQUIRE(counter.load(std::memory_order_relaxed) == (L + B - 1));
      REQUIRE(set.size() == W);
      counter = 0;
      barrier = 0;
      set.clear();
    },
    [n=0]() mutable { 
      return ++n >= 10 ? 1 : 0;
    },
    [&](){
      REQUIRE(barrier.load(std::memory_order_relaxed) == 0);
      REQUIRE(counter.load(std::memory_order_relaxed) == 0);
      REQUIRE(set.size() == 0);
    }
  );

  tf::Task prev, curr, second;
  
  // linear chain with delay to make workers sleep
  for(size_t l=0; l<L; l++) {

    curr = taskflow.emplace([&, l](){
      if(l) {
        counter.fetch_add(1, std::memory_order_relaxed);
      }
    });

    if(l) {
      curr.succeed(prev);
    }

    if(l==1) {
      second = curr;
    }

    prev = curr;
  }
  
  cond.precede(second, stop);


  // fork
  for(size_t b=0; b<B; b++) {
    tf::Task task = taskflow.emplace([&](){
      // record the threads
      {
        std::scoped_lock lock(mutex);
        set.insert(executor.this_worker_id());
      }

      // all threads should be notified
      barrier.fetch_add(1, std::memory_order_relaxed);
      while(barrier.load(std::memory_order_relaxed) < W){
        std::this_thread::yield();
      }
      
      // increment the counter
      counter.fetch_add(1, std::memory_order_relaxed);
    });
    task.succeed(curr)
        .precede(merge);
  }

  merge.precede(cond);

  //taskflow.dump(std::cout);
  executor.run(taskflow).wait();
}